

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb::BitpackingScanPartial<unsigned_int,int,unsigned_int>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  uint32_t *out;
  BitpackingMode BVar1;
  byte bVar2;
  data_ptr_t pdVar3;
  long lVar4;
  BitpackingScanState<unsigned_int,_int> *this;
  idx_t iVar5;
  ulong uVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  ulong size;
  idx_t iVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  this = (BitpackingScanState<unsigned_int,_int> *)
         unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
         operator->(&state->scan_state);
  pdVar3 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  if (scan_count != 0) {
    iVar10 = 0;
    auVar16 = _DAT_01df8090;
    auVar17 = _DAT_01df8070;
    auVar18 = _DAT_01defe80;
    do {
      if (this->current_group_offset == 0x800) {
        BitpackingScanState<unsigned_int,_int>::LoadNextGroup(this);
        auVar16 = _DAT_01df8090;
        auVar17 = _DAT_01df8070;
        auVar18 = _DAT_01defe80;
      }
      iVar5 = this->current_group_offset;
      BVar1 = (this->current_group).mode;
      uVar6 = scan_count - iVar10;
      if (BVar1 == CONSTANT_DELTA) {
        size = 0x800 - iVar5;
        if (uVar6 < 0x800 - iVar5) {
          size = uVar6;
        }
        if (size != 0) {
          uVar6 = 0;
          do {
            *(uint *)(pdVar3 + uVar6 * 4 + iVar10 * 4 + result_offset * 4) =
                 ((uint)iVar5 + (int)uVar6) * this->current_constant +
                 this->current_frame_of_reference;
            uVar6 = uVar6 + 1;
          } while (size != uVar6);
        }
LAB_01093671:
        iVar5 = iVar5 + size;
      }
      else {
        if (BVar1 == CONSTANT) {
          size = 0x800 - iVar5;
          if (uVar6 < 0x800 - iVar5) {
            size = uVar6;
          }
          if (scan_count != iVar10) {
            uVar8 = this->current_constant;
            uVar6 = scan_count * 4 + -4 + iVar10 * -4;
            auVar14._8_4_ = (int)uVar6;
            auVar14._0_8_ = uVar6;
            auVar14._12_4_ = (int)(uVar6 >> 0x20);
            auVar11._0_8_ = uVar6 >> 2;
            auVar11._8_8_ = auVar14._8_8_ >> 2;
            lVar4 = iVar10 * 4 + 0xc + result_offset * 4;
            auVar11 = auVar11 ^ auVar18;
            uVar9 = 0;
            do {
              auVar13._8_4_ = (int)uVar9;
              auVar13._0_8_ = uVar9;
              auVar13._12_4_ = (int)(uVar9 >> 0x20);
              auVar14 = (auVar13 | auVar17) ^ auVar18;
              iVar12 = auVar11._4_4_;
              if ((bool)(~(iVar12 < auVar14._4_4_ ||
                          auVar11._0_4_ < auVar14._0_4_ && auVar14._4_4_ == iVar12) & 1)) {
                *(uint *)(pdVar3 + uVar9 * 4 + lVar4 + -0xc) = uVar8;
              }
              if (auVar14._12_4_ <= auVar11._12_4_ &&
                  (auVar14._8_4_ <= auVar11._8_4_ || auVar14._12_4_ != auVar11._12_4_)) {
                *(uint *)(pdVar3 + uVar9 * 4 + lVar4 + -8) = uVar8;
              }
              auVar14 = (auVar13 | auVar16) ^ auVar18;
              iVar15 = auVar14._4_4_;
              if (iVar15 <= iVar12 && (iVar15 != iVar12 || auVar14._0_4_ <= auVar11._0_4_)) {
                *(uint *)(pdVar3 + uVar9 * 4 + lVar4 + -4) = uVar8;
                *(uint *)(pdVar3 + uVar9 * 4 + lVar4) = uVar8;
              }
              uVar9 = uVar9 + 4;
            } while (((uVar6 >> 2) + 4 & 0xfffffffffffffffc) != uVar9);
          }
          goto LAB_01093671;
        }
        uVar8 = (uint)iVar5 & 0x1f;
        uVar9 = (ulong)uVar8;
        size = 0x20 - uVar9;
        if (uVar6 < 0x20 - uVar9) {
          size = uVar6;
        }
        bVar2 = this->current_width;
        out = (uint32_t *)(pdVar3 + iVar10 * 4 + result_offset * 4);
        if ((size == 0x20) && (uVar9 == 0)) {
          duckdb_fastpforlib::fastunpack
                    ((uint32_t *)
                     (this->current_group_ptr + ((bVar2 * iVar5 >> 3) - (ulong)(uVar8 * bVar2 >> 3))
                     ),out,(uint)bVar2);
        }
        else {
          duckdb_fastpforlib::fastunpack
                    ((uint32_t *)
                     (this->current_group_ptr + ((bVar2 * iVar5 >> 3) - (ulong)(uVar8 * bVar2 >> 3))
                     ),this->decompression_buffer,(uint)bVar2);
          switchD_01602a8a::default(out,this->decompression_buffer + uVar9,size * 4);
        }
        auVar16 = _DAT_01df8090;
        if ((this->current_group).mode == DELTA_FOR) {
          uVar8 = this->current_frame_of_reference;
          if (uVar8 != 0 && scan_count != iVar10) {
            sVar7 = 0;
            do {
              out[sVar7] = out[sVar7] + uVar8;
              sVar7 = sVar7 + 1;
            } while (size != sVar7);
          }
          DeltaDecode<int>((int *)out,this->current_delta_offset,size);
          this->current_delta_offset = out[size - 1];
          auVar16 = _DAT_01df8090;
        }
        else {
          uVar8 = this->current_frame_of_reference;
          if (uVar8 != 0 && scan_count != iVar10) {
            sVar7 = 0;
            do {
              out[sVar7] = out[sVar7] + uVar8;
              sVar7 = sVar7 + 1;
            } while (size != sVar7);
          }
        }
        iVar5 = this->current_group_offset + size;
        auVar17 = _DAT_01df8070;
        auVar18 = _DAT_01defe80;
      }
      this->current_group_offset = iVar5;
      iVar10 = iVar10 + size;
    } while (iVar10 < scan_count);
  }
  return;
}

Assistant:

void BitpackingScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                           idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<BitpackingScanState<T>>();

	T *result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	idx_t scanned = 0;
	while (scanned < scan_count) {
		D_ASSERT(scan_state.current_group_offset <= BITPACKING_METADATA_GROUP_SIZE);

		// Exhausted this metadata group, move pointers to next group and load metadata for next group.
		if (scan_state.current_group_offset == BITPACKING_METADATA_GROUP_SIZE) {
			scan_state.LoadNextGroup();
		}

		idx_t offset_in_compression_group =
		    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

		if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *begin = result_data + result_offset + scanned;
			T *end = begin + remaining;
			std::fill(begin, end, scan_state.current_constant);
			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *target_ptr = result_data + result_offset + scanned;

			for (idx_t i = 0; i < to_scan; i++) {
				idx_t multiplier = scan_state.current_group_offset + i;
				// intended static casts to unsigned and back for defined wrapping of integers
				target_ptr[i] = static_cast<T>((static_cast<T_U>(scan_state.current_constant) * multiplier) +
				                               static_cast<T_U>(scan_state.current_frame_of_reference));
			}

			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
		         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

		idx_t to_scan = MinValue<idx_t>(scan_count - scanned, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE -
		                                                          offset_in_compression_group);
		// Calculate start of compression algorithm group
		data_ptr_t current_position_ptr =
		    scan_state.current_group_ptr + scan_state.current_group_offset * scan_state.current_width / 8;
		data_ptr_t decompression_group_start_pointer =
		    current_position_ptr - offset_in_compression_group * scan_state.current_width / 8;

		T *current_result_ptr = result_data + result_offset + scanned;

		if (to_scan == BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE && offset_in_compression_group == 0) {
			// Decompress directly into result vector
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(current_result_ptr), decompression_group_start_pointer,
			                                     scan_state.current_width, skip_sign_extend);
		} else {
			// Decompress compression algorithm to buffer
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
			                                     decompression_group_start_pointer, scan_state.current_width,
			                                     skip_sign_extend);

			memcpy(current_result_ptr, scan_state.decompression_buffer + offset_in_compression_group,
			       to_scan * sizeof(T));
		}

		if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
			ApplyFrameOfReference<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                           static_cast<T_S>(scan_state.current_frame_of_reference), to_scan);
			DeltaDecode<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                 static_cast<T_S>(scan_state.current_delta_offset), to_scan);
			scan_state.current_delta_offset = current_result_ptr[to_scan - 1];
		} else {
			ApplyFrameOfReference<T>(current_result_ptr, scan_state.current_frame_of_reference, to_scan);
		}

		scanned += to_scan;
		scan_state.current_group_offset += to_scan;
	}
}